

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_bufput_kfold_rep(jit_State *J)

{
  IRIns *pIVar1;
  uint64_t uVar2;
  TRef TVar3;
  SBuf *sb;
  GCobj *o;
  ulong uVar4;
  
  if (-1 < (short)(J->fold).left[0].field_0.op2) {
    pIVar1 = (J->cur).ir;
    uVar4 = (ulong)(J->fold).left[0].field_0.op1;
    if (-1 < *(short *)((long)pIVar1 + uVar4 * 8 + 2)) {
      uVar2 = (J->L->glref).ptr64;
      *(lua_State **)(uVar2 + 0xe0) = J->L;
      *(undefined8 *)(uVar2 + 200) = *(undefined8 *)(uVar2 + 0xd8);
      sb = lj_buf_putstr_rep((SBuf *)(uVar2 + 200),
                             (GCstr *)pIVar1[(ulong)*(ushort *)((long)pIVar1 + uVar4 * 8 + 2) + 1],
                             pIVar1[(J->fold).left[0].field_0.op2].i);
      (J->fold).ins.field_1.o = 'V';
      (J->fold).ins.field_0.op1 = pIVar1[uVar4].field_0.op1;
      o = (GCobj *)lj_buf_tostr(sb);
      TVar3 = lj_ir_kgc(J,o,IRT_STR);
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      return 1;
    }
  }
  TVar3 = lj_ir_emit(J);
  return TVar3;
}

Assistant:

LJFOLD(CALLL CARG IRCALL_lj_buf_putstr_rep)
LJFOLDF(bufput_kfold_rep)
{
  if (irref_isk(fleft->op2)) {
    IRIns *irc = IR(fleft->op1);
    if (irref_isk(irc->op2)) {
      SBuf *sb = lj_buf_tmp_(J->L);
      sb = lj_buf_putstr_rep(sb, ir_kstr(IR(irc->op2)), IR(fleft->op2)->i);
      fins->o = IR_BUFPUT;
      fins->op1 = irc->op1;
      fins->op2 = lj_ir_kstr(J, lj_buf_tostr(sb));
      return RETRYFOLD;
    }
  }
  return EMITFOLD;  /* Always emit, CSE later. */
}